

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_counted_ptr.h
# Opt level: O2

RefCountedPtr<raptor::Status> __thiscall
raptor::MakeRefCounted<raptor::Status,char*&>(raptor *this,char **args)

{
  Status *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (Status *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_38,*args,&local_39);
  Status::Status(this_00,&local_38);
  *(Status **)this = this_00;
  std::__cxx11::string::~string((string *)&local_38);
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

inline RefCountedPtr<T> MakeRefCounted(Args&&... args) {
    return RefCountedPtr<T>(new T(std::forward<Args>(args)...));
}